

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
::write_decimal<long_long>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
           *this,longlong value)

{
  ulong uVar1;
  bool bVar2;
  value_type vVar3;
  uint uVar4;
  byte bVar5;
  ulong uVar6;
  value_type *pvVar7;
  ulong uVar8;
  size_t sVar9;
  value_type vVar10;
  value_type *pvVar11;
  long lVar12;
  value_type local_28 [32];
  
  uVar6 = -value;
  if (0 < value) {
    uVar6 = value;
  }
  lVar12 = 0x3f;
  if ((uVar6 | 1) != 0) {
    for (; (uVar6 | 1) >> lVar12 == 0; lVar12 = lVar12 + -1) {
    }
  }
  uVar4 = ((uint)lVar12 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  uVar4 = (uVar4 - (uVar6 < *(ulong *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_64 +
                                      (ulong)uVar4 * 8))) + 1;
  if (value < 0) {
    pvVar11 = (this->out_).super_truncating_iterator_base<char_*>.out_;
    uVar8 = (this->out_).super_truncating_iterator_base<char_*>.count_;
    uVar1 = (this->out_).super_truncating_iterator_base<char_*>.limit_;
    local_28[0] = (this->out_).blackhole_;
    (this->out_).super_truncating_iterator_base<char_*>.count_ = uVar8 + 1;
    if (uVar8 < uVar1) {
      (this->out_).super_truncating_iterator_base<char_*>.out_ = pvVar11 + 1;
    }
    else {
      pvVar11 = local_28;
    }
    *pvVar11 = '-';
  }
  pvVar11 = local_28 + uVar4;
  uVar8 = uVar6;
  if (99 < uVar6) {
    do {
      uVar6 = uVar8 / 100;
      *(undefined2 *)(pvVar11 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)uVar8 + (int)uVar6 * -100) * 2)
      ;
      pvVar11 = pvVar11 + -2;
      bVar2 = 9999 < uVar8;
      uVar8 = uVar6;
    } while (bVar2);
  }
  pvVar7 = (this->out_).super_truncating_iterator_base<char_*>.out_;
  uVar8 = (this->out_).super_truncating_iterator_base<char_*>.limit_;
  sVar9 = (this->out_).super_truncating_iterator_base<char_*>.count_;
  vVar10 = (this->out_).blackhole_;
  if (uVar6 < 10) {
    bVar5 = (byte)uVar6 | 0x30;
    lVar12 = -1;
  }
  else {
    pvVar11[-1] = internal::basic_data<void>::DIGITS[(uVar6 * 2 & 0xffffffff) + 1];
    bVar5 = internal::basic_data<void>::DIGITS[uVar6 * 2 & 0x1fffffffe];
    lVar12 = -2;
  }
  pvVar11[lVar12] = bVar5;
  if (0 < (int)uVar4) {
    uVar6 = 0;
    do {
      vVar3 = local_28[uVar6];
      if (sVar9 + uVar6 < uVar8) {
        *pvVar7 = local_28[uVar6];
        vVar3 = vVar10;
      }
      vVar10 = vVar3;
      pvVar7 = pvVar7 + (sVar9 + uVar6 < uVar8);
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
    sVar9 = sVar9 + uVar6;
  }
  (this->out_).super_truncating_iterator_base<char_*>.out_ = pvVar7;
  (this->out_).super_truncating_iterator_base<char_*>.limit_ = uVar8;
  (this->out_).super_truncating_iterator_base<char_*>.count_ = sVar9;
  (this->out_).blackhole_ = vVar10;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }